

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall IRT::PrintVisitor::AddArrow(PrintVisitor *this,int child_id)

{
  string sStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,this->lastVisited + 1);
  std::operator+(&local_b8,"\t",&local_38);
  std::operator+(&local_98,&local_b8," -> ");
  std::__cxx11::to_string(&sStack_d8,child_id);
  std::operator+(&local_78,&local_98,&sStack_d8);
  std::operator+(&local_58,&local_78,"\n");
  std::__cxx11::string::append((string *)&this->description);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&sStack_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void IRT::PrintVisitor::AddArrow( int child_id ) {
    this->description += "\t" + std::to_string( lastVisited + 1 ) + " -> " + std::to_string( child_id ) + "\n";
}